

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodePCRelLabel19(MCInst *Inst,uint Imm,uint64_t Addr,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  int64_t ImmVal;
  undefined8 local_28;
  
  local_28 = (ulong)in_ESI;
  if ((in_ESI & 0x40000) != 0) {
    local_28 = local_28 | 0xfffffffffff80000;
  }
  MCOperand_CreateImm0(in_RDI,local_28);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodePCRelLabel19(MCInst *Inst, unsigned Imm,
		uint64_t Addr, const void *Decoder)
{
	int64_t ImmVal = Imm;

	// Sign-extend 19-bit immediate.
	if (ImmVal & (1 << (19 - 1)))
		ImmVal |= ~((1LL << 19) - 1);

	MCOperand_CreateImm0(Inst, ImmVal);
	return Success;
}